

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ssize_t __thiscall
Json::StyledWriter::write_abi_cxx11_(StyledWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long lVar1;
  Value *in_stack_00000038;
  StyledWriter *in_stack_00000040;
  Value *in_stack_00000058;
  StyledWriter *in_stack_00000060;
  Value *in_stack_00000218;
  StyledWriter *in_stack_00000220;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::clear();
  *(undefined1 *)(lVar1 + 0x68) = 0;
  std::__cxx11::string::clear();
  writeCommentBeforeValue(in_stack_00000040,in_stack_00000038);
  writeValue(in_stack_00000220,in_stack_00000218);
  writeCommentAfterValueOnSameLine(in_stack_00000060,in_stack_00000058);
  std::__cxx11::string::operator+=((string *)(lVar1 + 0x20),"\n");
  std::__cxx11::string::string((string *)this,(string *)(lVar1 + 0x20));
  return (ssize_t)this;
}

Assistant:

JSONCPP_STRING StyledWriter::write(const Value& root) {
  document_.clear();
  addChildValues_ = false;
  indentString_.clear();
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  document_ += "\n";
  return document_;
}